

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdAddScriptHashSign
              (void *handle,int net_type,char *tx_hex_string,char *txid,uint32_t vout,int hash_type,
              char *redeem_script,bool clear_stack,char **tx_string)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *in_RCX;
  OutPoint *in_RDX;
  uint32_t in_R8D;
  char *in_stack_00000008;
  byte in_stack_00000010;
  undefined8 *in_stack_00000018;
  CfdException *except;
  exception *std_except;
  uint32_t index_1;
  ConfidentialTransactionContext tx_1;
  uint32_t index;
  TransactionContext tx;
  Script script;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> list;
  OutPoint outpoint;
  bool is_bitcoin;
  bool is_witness;
  AddressType addr_type;
  Script *in_stack_fffffffffffffa78;
  ConfidentialTransactionContext *in_stack_fffffffffffffa80;
  OutPoint *in_stack_fffffffffffffa88;
  uint32_t in_stack_fffffffffffffa90;
  uint32_t in_stack_fffffffffffffa94;
  undefined8 in_stack_fffffffffffffa98;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffaa0;
  allocator *paVar5;
  OutPoint *in_stack_fffffffffffffab8;
  ConfidentialTransactionContext *in_stack_fffffffffffffac0;
  TransactionContext *this;
  bool *in_stack_fffffffffffffad8;
  undefined8 in_stack_fffffffffffffae0;
  int hash_type_00;
  string *message;
  string local_4a8;
  Script local_488;
  uint32_t local_450;
  allocator local_449;
  string local_448 [32];
  ConfidentialTransaction local_428 [2];
  string local_370;
  Script local_350;
  uint32_t local_318;
  undefined1 local_311 [33];
  Transaction local_2f0 [2];
  allocator local_231;
  string local_230;
  Script local_210;
  string local_1b9;
  Txid local_198;
  OutPoint local_178;
  byte local_14a;
  byte local_149;
  AddressType local_148;
  undefined1 local_142;
  allocator local_141;
  string local_140 [32];
  CfdSourceLocation local_120;
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  CfdSourceLocation local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  byte local_31;
  uint32_t local_2c;
  char *local_28;
  OutPoint *local_20;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffa98 >> 0x20);
  hash_type_00 = (int)((ulong)in_stack_fffffffffffffae0 >> 0x20);
  local_31 = in_stack_00000010 & 1;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString((char *)local_20);
  if (bVar1) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0x6b7;
    local_60.funcname = "CfdAddScriptHashSign";
    cfd::core::logger::warn<>(&local_60,"tx is null or empty.");
    local_82 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Failed to parameter. tx is null or empty.",&local_81);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffaa0,error_code,
               (string *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    local_82 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (bVar1) {
    local_a0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_a0.filename = local_a0.filename + 1;
    local_a0.line = 0x6bd;
    local_a0.funcname = "CfdAddScriptHashSign";
    cfd::core::logger::warn<>(&local_a0,"txid is null or empty.");
    local_c2 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"Failed to parameter. txid is null or empty.",&local_c1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffaa0,error_code,
               (string *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    local_c2 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(in_stack_00000008);
  if (bVar1) {
    local_e0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_e0.filename = local_e0.filename + 1;
    local_e0.line = 0x6c3;
    local_e0.funcname = "CfdAddScriptHashSign";
    cfd::core::logger::warn<>(&local_e0,"redeem_script is null or empty.");
    local_102 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_100,"Failed to parameter. redeem_script is null or empty.",&local_101);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffaa0,error_code,
               (string *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    local_102 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000018 != (undefined8 *)0x0) {
    local_148 = cfd::capi::ConvertHashToAddressType(hash_type_00);
    local_149 = 1;
    if ((local_148 == kP2shAddress) || (local_148 == kP2pkhAddress)) {
      local_149 = 0;
    }
    local_14a = 0;
    cfd::capi::ConvertNetType(hash_type_00,in_stack_fffffffffffffad8);
    message = &local_1b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b9.field_0x1,local_28,(allocator *)message);
    cfd::core::Txid::Txid(&local_198,(string *)&local_1b9.field_0x1);
    cfd::core::OutPoint::OutPoint(&local_178,&local_198,local_2c);
    cfd::core::Txid::~Txid((Txid *)0x617770);
    std::__cxx11::string::~string((string *)&local_1b9.field_0x1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
              ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)0x617797);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,in_stack_00000008,&local_231);
    cfd::core::Script::Script(&local_210,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    if ((local_14a & 1) == 0) {
      paVar5 = &local_449;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_448,(char *)local_20,paVar5);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                (in_stack_fffffffffffffa80,(string *)in_stack_fffffffffffffa78);
      std::__cxx11::string::~string(local_448);
      std::allocator<char>::~allocator((allocator<char> *)&local_449);
      uVar2 = cfd::ConfidentialTransactionContext::GetTxInIndex
                        (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
      in_stack_fffffffffffffa94 = uVar2;
      local_450 = uVar2;
      if ((local_31 & 1) != 0) {
        if ((local_149 & 1) == 0) {
          cfd::core::Script::Script(&local_488);
          cfd::core::ConfidentialTransaction::SetUnlockingScript(local_428,uVar2,&local_488);
          cfd::core::Script::~Script((Script *)in_stack_fffffffffffffa80);
          in_stack_fffffffffffffa90 = uVar2;
        }
        else {
          cfd::core::ConfidentialTransaction::RemoveScriptWitnessStackAll(local_428,uVar2);
          in_stack_fffffffffffffa94 = uVar2;
        }
      }
      cfd::ConfidentialTransactionContext::AddScriptHashSign
                ((ConfidentialTransactionContext *)
                 CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                 in_stack_fffffffffffffa88,
                 (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                 in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,0,false);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                (&local_4a8,&local_428[0].super_AbstractTransaction);
      pcVar4 = cfd::capi::CreateString(message);
      *in_stack_00000018 = pcVar4;
      std::__cxx11::string::~string((string *)&local_4a8);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                (in_stack_fffffffffffffa80);
    }
    else {
      this = (TransactionContext *)local_311;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_311 + 1),(char *)local_20,(allocator *)this);
      cfd::TransactionContext::TransactionContext
                ((TransactionContext *)in_stack_fffffffffffffa80,(string *)in_stack_fffffffffffffa78
                );
      std::__cxx11::string::~string((string *)(local_311 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_311);
      uVar2 = cfd::TransactionContext::GetTxInIndex(this,local_20);
      local_318 = uVar2;
      if ((local_31 & 1) != 0) {
        if ((local_149 & 1) == 0) {
          cfd::core::Script::Script(&local_350);
          cfd::core::Transaction::SetUnlockingScript(local_2f0,uVar2,&local_350);
          cfd::core::Script::~Script((Script *)in_stack_fffffffffffffa80);
        }
        else {
          cfd::core::Transaction::RemoveScriptWitnessStackAll(local_2f0,uVar2);
        }
      }
      cfd::TransactionContext::AddScriptHashSign
                ((TransactionContext *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90)
                 ,in_stack_fffffffffffffa88,
                 (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                 in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,0,false);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                (&local_370,&local_2f0[0].super_AbstractTransaction);
      pcVar4 = cfd::capi::CreateString(message);
      *in_stack_00000018 = pcVar4;
      std::__cxx11::string::~string((string *)&local_370);
      cfd::TransactionContext::~TransactionContext((TransactionContext *)in_stack_fffffffffffffa80);
    }
    local_4 = 0;
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffffa80);
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
              ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
               CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    cfd::core::OutPoint::~OutPoint((OutPoint *)0x617d91);
    return local_4;
  }
  local_120.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
               ,0x2f);
  local_120.filename = local_120.filename + 1;
  local_120.line = 0x6c9;
  local_120.funcname = "CfdAddScriptHashSign";
  cfd::core::logger::warn<>(&local_120,"tx output is null.");
  local_142 = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"Failed to parameter. tx output is null.",&local_141);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffaa0,error_code,
             (string *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
  local_142 = 0;
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddScriptHashSign(
    void* handle, int net_type, const char* tx_hex_string, const char* txid,
    uint32_t vout, int hash_type, const char* redeem_script, bool clear_stack,
    char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(redeem_script)) {
      warn(CFD_LOG_SOURCE, "redeem_script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. redeem_script is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    bool is_witness = true;
    if ((addr_type == AddressType::kP2shAddress) ||
        (addr_type == AddressType::kP2pkhAddress)) {
      is_witness = false;
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    OutPoint outpoint(Txid(txid), vout);
    std::vector<SignParameter> list;
    Script script = Script(std::string(redeem_script));
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      uint32_t index = tx.GetTxInIndex(outpoint);
      if (clear_stack) {
        if (is_witness) {
          tx.RemoveScriptWitnessStackAll(index);
        } else {
          tx.SetUnlockingScript(index, Script());
        }
      }
      tx.AddScriptHashSign(outpoint, list, script, addr_type);
      *tx_string = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      uint32_t index = tx.GetTxInIndex(outpoint);
      if (clear_stack) {
        if (is_witness) {
          tx.RemoveScriptWitnessStackAll(index);
        } else {
          tx.SetUnlockingScript(index, Script());
        }
      }
      tx.AddScriptHashSign(outpoint, list, script, addr_type);
      *tx_string = CreateString(tx.GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}